

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Float __thiscall pbrt::HaltonSampler::SampleDimension(HaltonSampler *this,int dimension)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  Float FVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  
  auVar7 = in_ZMM0._0_16_;
  if (this->randomizeStrategy < (Owen|CranleyPatterson)) {
    switch(this->randomizeStrategy) {
    case None:
      FVar6 = RadicalInverse(dimension,this->haltonIndex);
      return FVar6;
    case CranleyPatterson:
      uVar5 = MixBits(((ulong)(uint)dimension << 0x20) + 1);
      auVar7 = vcvtusi2ss_avx512f(auVar7,(int)uVar5);
      FVar6 = RadicalInverse(dimension,this->haltonIndex);
      fVar1 = FVar6 + auVar7._0_4_ * 2.3283064e-10;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416(0x3f800000),9);
      bVar3 = (bool)((byte)uVar2 & 1);
      return (Float)((uint)bVar3 * (int)fVar1 + (uint)!bVar3 * (int)(fVar1 + -1.0));
    case PermuteDigits:
      FVar6 = ScrambledRadicalInverse
                        (dimension,this->haltonIndex,this->digitPermutations->ptr + dimension);
      return FVar6;
    case Owen:
      uVar5 = this->haltonIndex;
      uVar4 = MixBits(((ulong)(uint)dimension << 0x20) + 1);
      FVar6 = OwenScrambledRadicalInverse(dimension,uVar5,(uint32_t)uVar4);
      return FVar6;
    }
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.h"
           ,0x88,"Unhandled randomization strategy");
}

Assistant:

PBRT_CPU_GPU
    Float SampleDimension(int dimension) const {
        switch (randomizeStrategy) {
        case RandomizeStrategy::None:
            return RadicalInverse(dimension, haltonIndex);
        case RandomizeStrategy::CranleyPatterson: {
            Float u = uint32_t(MixBits(1 + (uint64_t(dimension) << 32))) * 0x1p-32f;
            Float s = RadicalInverse(dimension, haltonIndex) + u;
            if (s >= 1)
                s -= 1;
            return s;
        }
        case RandomizeStrategy::PermuteDigits:
            return ScrambledRadicalInverse(dimension, haltonIndex,
                                           (*digitPermutations)[dimension]);
        case RandomizeStrategy::Owen:
            return OwenScrambledRadicalInverse(dimension, haltonIndex,
                                               MixBits(1 + (uint64_t(dimension) << 32)));
        default:
            LOG_FATAL("Unhandled randomization strategy");
            return {};
        }
    }